

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::Dump(Func *this,IRDumpFlags flags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *local_30;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  IRDumpFlags flags_local;
  Func *this_local;
  
  DumpHeader(this);
  instrStop = (Instr *)0x0;
  local_30 = this->m_headInstr;
  do {
    if (local_30 == (Instr *)0x0) {
      Output::Flush();
      return;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != local_30)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x885,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    instrStop = local_30;
    IR::Instr::DumpGlobOptInstrString(local_30);
    (**local_30->_vptr_Instr)(local_30,(ulong)flags);
    local_30 = local_30->m_next;
  } while( true );
}

Assistant:

void
Func::Dump(IRDumpFlags flags)
{
    this->DumpHeader();

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instr->DumpGlobOptInstrString();
        instr->Dump(flags);
    }NEXT_INSTR_IN_FUNC;

    Output::Flush();
}